

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

TRef lj_ir_tonumber(jit_State *J,TRef tr)

{
  TRef in_ESI;
  jit_State *in_RDI;
  TraceError in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (5 < (in_ESI >> 0x18 & 0x1f) - 0xe) {
    if ((in_ESI & 0x1f000000) != 0x4000000) {
      lj_trace_err((jit_State *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc
                  );
    }
    (in_RDI->fold).ins.field_0.ot = 0x588e;
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)in_ESI;
    (in_RDI->fold).ins.field_0.op2 = 0;
    in_ESI = lj_opt_fold(in_RDI);
  }
  return in_ESI;
}

Assistant:

TRef LJ_FASTCALL lj_ir_tonumber(jit_State *J, TRef tr)
{
  if (!tref_isnumber(tr)) {
    if (tref_isstr(tr))
      tr = emitir(IRTG(IR_STRTO, IRT_NUM), tr, 0);
    else
      lj_trace_err(J, LJ_TRERR_BADTYPE);
  }
  return tr;
}